

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcodeType
          (BinaryReaderObjdumpDisassemble *this,Type type)

{
  Enum EVar1;
  char *fmt;
  Type local_38;
  string local_30;
  
  if (this->in_function_body != true) {
    return (Result)Ok;
  }
  local_38 = type;
  if ((this->super_BinaryReaderObjdumpBase).current_opcode.enum_ == SelectT) {
    Type::GetName_abi_cxx11_(&local_30,&local_38);
    LogOpcode(this,local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return (Result)Ok;
    }
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    return (Result)Ok;
  }
  EVar1 = type.enum_;
  if (EVar1 < ExnRef) {
    if (EVar1 == Array) {
      fmt = "array";
      goto LAB_0011321d;
    }
    if (EVar1 == Struct) {
      fmt = "struct";
      goto LAB_0011321d;
    }
  }
  else {
    if (EVar1 == ExnRef) {
      fmt = "exn";
      goto LAB_0011321d;
    }
    if (EVar1 == FuncRef) {
      fmt = "func";
      goto LAB_0011321d;
    }
    if (EVar1 == ExternRef) {
      fmt = "extern";
      goto LAB_0011321d;
    }
  }
  fmt = "<invalid>";
LAB_0011321d:
  LogOpcode(this,fmt);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeType(Type type) {
  if (!in_function_body) {
    return Result::Ok;
  }
  if (current_opcode == Opcode::SelectT) {
    LogOpcode(type.GetName().c_str());
  } else {
    LogOpcode(type.GetRefKindName());
  }
  return Result::Ok;
}